

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

bool __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::rd_string
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,char *str_input,
          unsigned_fast_type count,int base_hint)

{
  short *psVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  representation_type *prVar9;
  byte bVar10;
  ushort uVar11;
  uint uVar12;
  byte bVar13;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 local_50 [16];
  value_type_conflict3 vStack_40;
  undefined1 auStack_3e [14];
  
  prVar9 = &this->values;
  (prVar9->super_array<unsigned_short,_16UL>).elems[8] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[9] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[10] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[0xb] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[0xc] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[0xd] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[0xe] = 0;
  (prVar9->super_array<unsigned_short,_16UL>).elems[0xf] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[0] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[1] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[2] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[3] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[4] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[5] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[6] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[7] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      return true;
    }
    uVar16 = 0;
    do {
      count = uVar16 + 1;
      lVar14 = uVar16 + 1;
      uVar16 = count;
    } while (str_input[lVar14] != '\0');
  }
  if (count == 0) {
    if ((char)base_hint == '\0') {
      base_hint = 10;
    }
    bVar17 = false;
    count = 0;
    uVar16 = 0;
  }
  else {
    bVar17 = *str_input == '-';
    uVar16 = (ulong)(*str_input == '+' || bVar17);
    if ((char)base_hint == '\0') {
      base_hint = 10;
      if (uVar16 < count) {
        if (str_input[uVar16] == '0') {
          if ((byte)(str_input[uVar16 + 1] - 0x30U) < 9) {
            uVar16 = uVar16 + 1;
            base_hint = 8;
          }
          else if ((byte)(str_input[uVar16 + 1] | 0x20U) == 0x78) {
            uVar16 = uVar16 | 2;
            base_hint = 0x10;
          }
        }
      }
      else {
        count = 1;
        uVar16 = 1;
      }
    }
  }
  bVar15 = true;
  if (count <= uVar16) {
LAB_00123941:
    if (bVar17) {
      uVar6 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 2);
      uVar7 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 4);
      uVar8 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 6);
      uVar12 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 8);
      uVar3 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 10);
      uVar4 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      uVar5 = *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xe);
      *(uint *)(this->values).super_array<unsigned_short,_16UL>.elems =
           *(uint *)(this->values).super_array<unsigned_short,_16UL>.elems ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 2) = uVar6 ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) = uVar7 ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 6) = uVar8 ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) = uVar12 ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 10) = uVar3 ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) = uVar4 ^ 0xffffffff;
      *(uint *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xe) = uVar5 ^ 0xffffffff;
      lVar14 = 0;
      do {
        psVar1 = (short *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar14);
        *psVar1 = *psVar1 + 1;
        if (*psVar1 != 0) {
          return bVar15;
        }
        bVar17 = lVar14 != 0x1e;
        lVar14 = lVar14 + 2;
      } while (bVar17);
    }
    return bVar15;
  }
  do {
    bVar10 = str_input[uVar16];
    bVar15 = true;
    if (bVar10 != 0x27) {
      if ((char)base_hint == '\x10') {
        bVar13 = bVar10 - 0x30;
        bVar15 = (bVar13 < 10 || (byte)(bVar10 + 0xbf) < 6) || (byte)(bVar10 + 0x9f) < 6;
        if ((bVar13 < 10) ||
           ((bVar10 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar10 - 0x41) & 0x3f) & 1) != 0)))
           ) {
          if ((byte)(bVar10 + 0x9f) < 6) {
            bVar10 = bVar10 + 0xa9;
          }
          else if ((byte)(bVar10 + 0xbf) < 6) {
            bVar10 = bVar10 - 0x37;
          }
          else {
            bVar10 = bVar10 - 0x30;
            if (9 < bVar13) {
              bVar10 = 0;
            }
          }
          uVar11 = 0;
          lVar14 = 0;
          do {
            uVar2 = *(ushort *)
                     ((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar14);
            *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar14) =
                 uVar11 | uVar2 << 4;
            lVar14 = lVar14 + 2;
            uVar11 = uVar2 >> 0xc;
          } while (lVar14 != 0x20);
LAB_00123925:
          (this->values).super_array<unsigned_short,_16UL>.elems[0] =
               (this->values).super_array<unsigned_short,_16UL>.elems[0] | (ushort)bVar10;
        }
      }
      else if ((base_hint & 0xffU) == 10) {
        if (9 < (byte)(bVar10 - 0x30)) goto LAB_0012393e;
        lVar14 = 0;
        uVar12 = 0;
        do {
          uVar11 = (this->values).super_array<unsigned_short,_16UL>.elems[lVar14];
          uVar12 = uVar12 + ((uint)uVar11 + (uint)uVar11 * 4) * 2;
          (this->values).super_array<unsigned_short,_16UL>.elems[lVar14] =
               (value_type_conflict3)uVar12;
          uVar12 = uVar12 >> 0x10;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x10);
        auStack_3e = SUB1614((undefined1  [16])0x0,2);
        local_50._2_14_ = SUB1614((undefined1  [16])0x0,0);
        vStack_40 = 0;
        local_50._0_2_ = ZEXT12((byte)(bVar10 - 0x30));
        operator+=(this,(uintwide_t<256U,_unsigned_short,_void,_true> *)local_50);
      }
      else if ((base_hint & 0xffU) == 8) {
        bVar10 = bVar10 - 0x30;
        if (bVar10 < 9) {
          uVar11 = 0;
          lVar14 = 0;
          do {
            uVar2 = *(ushort *)
                     ((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar14);
            *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar14) =
                 uVar11 | uVar2 * 8;
            lVar14 = lVar14 + 2;
            uVar11 = uVar2 >> 0xd;
          } while (lVar14 != 0x20);
          goto LAB_00123925;
        }
LAB_0012393e:
        bVar15 = false;
        goto LAB_00123941;
      }
    }
    uVar16 = uVar16 + 1;
    if ((count <= uVar16) || (bVar15 == false)) goto LAB_00123941;
  } while( true );
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }